

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3Backwards::OPline::T_p(OPline *this,double p)

{
  double dVar1;
  size_t i;
  ulong uVar2;
  double x;
  double dVar3;
  double dVar4;
  
  x = log(p);
  dVar4 = 0.0;
  for (uVar2 = 0; uVar2 < (this->super_Region3RegionDivision).N; uVar2 = uVar2 + 1) {
    dVar1 = (this->super_Region3RegionDivision).n.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar2];
    dVar3 = powi(x,(this->super_Region3RegionDivision).I.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar2]);
    dVar4 = dVar4 + dVar3 * dVar1;
  }
  return dVar4;
}

Assistant:

virtual double T_p(double p){
                const double pi = p/(1.0*p_fact), ln_pi = log(pi);
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*powi(ln_pi, I[i]);
                }
                return summer*1.0;  // sum is multiplied by T* = 1.0 [K]
            }